

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O1

void __thiscall
ki::protocol::dml::MessageTemplate::set_handler(MessageTemplate *this,string *handler)

{
  Record *this_00;
  pointer pcVar1;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pFVar2;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string local_40;
  
  this_00 = this->m_record;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"_MsgHandler","");
  pFVar2 = ki::dml::Record::add_field<std::__cxx11::string>(this_00,&local_40,true);
  pcVar1 = (handler->_M_dataplus)._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + handler->_M_string_length);
  std::__cxx11::string::_M_assign((string *)&pFVar2->m_value);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void MessageTemplate::set_handler(std::string handler)
	{
		m_record->add_field<ki::dml::STR>("_MsgHandler")->set_value(handler);
	}